

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderCross.h
# Opt level: O2

void __thiscall FIX44::NewOrderCross::NoSides::NoPartyIDs::NoPartyIDs(NoPartyIDs *this)

{
  message_order local_30;
  
  FIX::message_order::message_order(&local_30,0x1c0,0x1bf,0x1c4,0x322,0);
  FIX::Group::Group(&this->super_Group,0x1c5,0x1c0,&local_30);
  FIX::shared_array<int>::~shared_array(&local_30.m_groupOrder);
  *(undefined ***)&this->super_Group = &PTR__FieldMap_002fb6d0;
  return;
}

Assistant:

NoPartyIDs() : FIX::Group(453,448,FIX::message_order(448,447,452,802,0)) {}